

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd_linux.c
# Opt level: O2

int system_vforkfd(int flags,pid_t *ppid,_func_int_void_ptr *childFn,void *token,int *system)

{
  int iVar1;
  int iVar2;
  size_t __n;
  void *__s;
  long in_FS_OFFSET;
  undefined1 auStack_c0 [36];
  int local_9c;
  int *local_98;
  void *local_90;
  int local_84;
  long local_80;
  
  local_80 = *(long *)(in_FS_OFFSET + 0x28);
  local_9c = flags;
  local_98 = ppid;
  local_90 = token;
  __n = sysconf(0xfa);
  __s = (void *)((ulong)(auStack_c0 + -(__n + 0xf & 0xfffffffffffffff0)) & 0xffffffffffffffc0);
  if (__n != 0) {
    *(undefined8 *)((long)__s + -8) = 0x3e60af;
    memset(__s,0xaa,__n);
  }
  local_84 = -0x55555556;
  *(undefined8 *)((long)__s + -8) = 0x3e60bb;
  iVar2 = system_forkfd_availability();
  if (iVar2 < 0) {
    *system = 0;
    *(undefined8 *)((long)__s + -8) = 0xffffffffffffffff;
    iVar2 = (int)*(undefined8 *)((long)__s + -8);
  }
  else {
    *system = 1;
    *(undefined8 *)((long)__s + -0x10) = 0;
    *(undefined8 *)((long)__s + -0x18) = 0x3e60ef;
    iVar2 = clone((__fn *)childFn,(void *)((long)__s + __n),0x5111,local_90,&local_84,0);
    iVar1 = local_84;
    if (-1 < iVar2) {
      if (local_98 != (int *)0x0) {
        *local_98 = iVar2;
      }
      *(undefined8 *)((long)__s + -8) = 0x3e6113;
      system_forkfd_pidfd_set_flags(local_84,local_9c);
      iVar2 = iVar1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_80) {
    return iVar2;
  }
  *(code **)((long)__s + -8) = forkfd_wait4;
  __stack_chk_fail();
}

Assistant:

int system_vforkfd(int flags, pid_t *ppid, int (*childFn)(void *), void *token, int *system)
{
    __attribute__((aligned(64))) char childStack[SIGSTKSZ];
    pid_t pid;
    int pidfd;
    unsigned long cloneflags = CLONE_PIDFD | CLONE_VFORK | CLONE_VM | SIGCHLD;

    int state = system_forkfd_availability();
    if (state < 0) {
        *system = 0;
        return state;
    }
    *system = 1;

    pid = clone(childFn, childStack + sizeof(childStack), cloneflags, token, &pidfd, NULL, NULL);
    if (pid < 0)
        return pid;
    if (ppid)
        *ppid = pid;
    return system_forkfd_pidfd_set_flags(pidfd, flags);
}